

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O1

CURLcode Curl_SOCKS4(char *proxy_name,char *hostname,int remote_port,int sockindex,connectdata *conn
                    ,_Bool protocol4a)

{
  Curl_easy *data;
  bool bVar1;
  CURLcode extraout_EAX;
  int iVar2;
  CURLcode extraout_EAX_00;
  CURLcode CVar3;
  CURLcode CVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  Curl_addrinfo *ai;
  ulong uVar9;
  curl_socket_t cVar10;
  ulong uVar11;
  Curl_dns_entry *dns;
  curl_socket_t local_1ac;
  unsigned_short ip [4];
  uchar socksreq [262];
  char buf [64];
  
  cVar10 = conn->sock[sockindex];
  data = conn->data;
  lVar5 = Curl_timeleft(data,(timeval *)0x0,true);
  if (lVar5 < 0) {
    Curl_failf(data,"Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }
  local_1ac = cVar10;
  curlx_nonblock(cVar10,0);
  Curl_infof(data,"SOCKS4 communication to %s:%d\n",hostname,(ulong)(uint)remote_port);
  socksreq[0] = '\x04';
  socksreq[1] = '\x01';
  socksreq[2] = (uchar)((uint)remote_port >> 8);
  socksreq[3] = (uchar)remote_port;
  CVar4 = extraout_EAX;
  if (!protocol4a) {
    iVar2 = Curl_resolv(conn,hostname,remote_port,&dns);
    if (iVar2 == -1) {
      CVar4 = CURLE_COULDNT_RESOLVE_PROXY;
      bVar1 = false;
    }
    else {
      if (dns == (Curl_dns_entry *)0x0) {
        ai = (Curl_addrinfo *)0x0;
      }
      else {
        ai = dns->addr;
      }
      if (ai != (Curl_addrinfo *)0x0) {
        Curl_printable_address(ai,buf,0x40);
        iVar2 = __isoc99_sscanf(buf,"%hu.%hu.%hu.%hu",ip,ip + 1,ip + 2,ip + 3);
        if (iVar2 == 4) {
          socksreq[5] = (uchar)ip[1];
          socksreq[4] = (uchar)ip[0];
          socksreq[6] = (uchar)ip[2];
          socksreq[7] = (uchar)ip[3];
          Curl_infof(data,"SOCKS4 connect to %s (locally resolved)\n",buf);
          Curl_resolv_unlock(data,dns);
          bVar1 = true;
          CVar4 = extraout_EAX_00;
          goto LAB_0013adbb;
        }
        Curl_infof(data,"SOCKS4 connect to %s (locally resolved)\n",buf);
        Curl_resolv_unlock(data,dns);
      }
      bVar1 = false;
      Curl_failf(data,"Failed to resolve \"%s\" for SOCKS4 connect.",hostname);
      CVar4 = CURLE_COULDNT_RESOLVE_HOST;
    }
LAB_0013adbb:
    if (!bVar1) {
      return CVar4;
    }
  }
  socksreq._8_2_ = (ushort)socksreq[9] << 8;
  if (proxy_name != (char *)0x0) {
    sVar6 = strlen(proxy_name);
    if (0xfd < sVar6) {
      Curl_failf(data,"Too long SOCKS proxy name, can\'t use!\n");
      return CURLE_COULDNT_CONNECT;
    }
    memcpy(socksreq + 8,proxy_name,sVar6 + 1);
  }
  sVar6 = strlen((char *)(socksreq + 8));
  lVar5 = (long)((int)sVar6 + 9);
  if (protocol4a) {
    socksreq[4] = '\0';
    socksreq[5] = '\0';
    socksreq[6] = '\0';
    socksreq[7] = '\x01';
    sVar6 = strlen(hostname);
    cVar10 = local_1ac;
    if ((long)(sVar6 + lVar5 + 1) < 0x107) {
      lVar7 = sVar6 + 1;
      strcpy((char *)(socksreq + lVar5),hostname);
    }
    else {
      lVar7 = 0;
    }
  }
  else {
    lVar7 = 0;
    cVar10 = local_1ac;
  }
  CVar3 = Curl_write_plain(conn,cVar10,socksreq,(size_t)(lVar5 + lVar7),(ssize_t *)&dns);
  if ((CVar3 == CURLE_OK) && (dns == (Curl_dns_entry *)(lVar5 + lVar7))) {
    if (protocol4a && lVar7 == 0) {
      sVar6 = strlen(hostname);
      CVar3 = Curl_write_plain(conn,cVar10,hostname,(size_t)(sVar6 + 1),(ssize_t *)&dns);
      if ((CVar3 != CURLE_OK) || (dns != (Curl_dns_entry *)(sVar6 + 1))) goto LAB_0013af3d;
    }
    iVar2 = Curl_blockread_all(conn,cVar10,(char *)socksreq,8,(ssize_t *)buf);
    if ((iVar2 != 0) || (buf._0_8_ != 8)) {
      pcVar8 = "Failed to receive SOCKS4 connect request ack.";
      goto LAB_0013af4d;
    }
    if (socksreq[0] != '\0') {
      pcVar8 = "SOCKS4 reply has wrong version, version should be 4.";
      goto LAB_0013af4d;
    }
    uVar11 = (ulong)socksreq[1];
    switch(socksreq[1]) {
    case 'Z':
      pcVar8 = "";
      if (protocol4a) {
        pcVar8 = "a";
      }
      Curl_infof(data,"SOCKS4%s request granted.\n",pcVar8);
      bVar1 = true;
      goto LAB_0013af5e;
    case '[':
      uVar9 = (ulong)(ushort)(socksreq._8_2_ << 8 | (ushort)socksreq._8_2_ >> 8);
      pcVar8 = 
      "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed.";
      uVar11 = 0x5b;
      break;
    case '\\':
      uVar9 = (ulong)(ushort)(socksreq._8_2_ << 8 | (ushort)socksreq._8_2_ >> 8);
      pcVar8 = 
      "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
      ;
      uVar11 = 0x5c;
      break;
    case ']':
      uVar9 = (ulong)(ushort)(socksreq._8_2_ << 8 | (ushort)socksreq._8_2_ >> 8);
      pcVar8 = 
      "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
      ;
      uVar11 = 0x5d;
      break;
    default:
      uVar9 = (ulong)(ushort)(socksreq._8_2_ << 8 | (ushort)socksreq._8_2_ >> 8);
      pcVar8 = "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.";
    }
    Curl_failf(data,pcVar8,(ulong)socksreq[4],(ulong)socksreq[5],(ulong)socksreq[6],
               (ulong)socksreq[7],uVar9,uVar11);
  }
  else {
LAB_0013af3d:
    pcVar8 = "Failed to send SOCKS4 connect request.";
LAB_0013af4d:
    Curl_failf(data,pcVar8);
  }
  bVar1 = false;
  CVar4 = CURLE_COULDNT_CONNECT;
LAB_0013af5e:
  if (bVar1) {
    curlx_nonblock(local_1ac,1);
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_SOCKS4(const char *proxy_name,
                     const char *hostname,
                     int remote_port,
                     int sockindex,
                     struct connectdata *conn,
                     bool protocol4a)
{
#define SOCKS4REQLEN 262
  unsigned char socksreq[SOCKS4REQLEN]; /* room for SOCKS4 request incl. user
                                           id */
  int result;
  CURLcode code;
  curl_socket_t sock = conn->sock[sockindex];
  struct Curl_easy *data = conn->data;

  if(Curl_timeleft(data, NULL, TRUE) < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  (void)curlx_nonblock(sock, FALSE);

  infof(data, "SOCKS4 communication to %s:%d\n", hostname, remote_port);

  /*
   * Compose socks4 request
   *
   * Request format
   *
   *     +----+----+----+----+----+----+----+----+----+----+....+----+
   *     | VN | CD | DSTPORT |      DSTIP        | USERID       |NULL|
   *     +----+----+----+----+----+----+----+----+----+----+....+----+
   * # of bytes:  1    1      2              4           variable       1
   */

  socksreq[0] = 4; /* version (SOCKS4) */
  socksreq[1] = 1; /* connect */
  socksreq[2] = (unsigned char)((remote_port >> 8) & 0xff); /* PORT MSB */
  socksreq[3] = (unsigned char)(remote_port & 0xff);        /* PORT LSB */

  /* DNS resolve only for SOCKS4, not SOCKS4a */
  if(!protocol4a) {
    struct Curl_dns_entry *dns;
    Curl_addrinfo *hp=NULL;
    int rc;

    rc = Curl_resolv(conn, hostname, remote_port, &dns);

    if(rc == CURLRESOLV_ERROR)
      return CURLE_COULDNT_RESOLVE_PROXY;

    if(rc == CURLRESOLV_PENDING)
      /* ignores the return code, but 'dns' remains NULL on failure */
      (void)Curl_resolver_wait_resolv(conn, &dns);

    /*
     * We cannot use 'hostent' as a struct that Curl_resolv() returns.  It
     * returns a Curl_addrinfo pointer that may not always look the same.
     */
    if(dns)
      hp=dns->addr;
    if(hp) {
      char buf[64];
      unsigned short ip[4];
      Curl_printable_address(hp, buf, sizeof(buf));

      if(4 == sscanf(buf, "%hu.%hu.%hu.%hu",
                     &ip[0], &ip[1], &ip[2], &ip[3])) {
        /* Set DSTIP */
        socksreq[4] = (unsigned char)ip[0];
        socksreq[5] = (unsigned char)ip[1];
        socksreq[6] = (unsigned char)ip[2];
        socksreq[7] = (unsigned char)ip[3];
      }
      else
        hp = NULL; /* fail! */

      infof(data, "SOCKS4 connect to %s (locally resolved)\n", buf);

      Curl_resolv_unlock(data, dns); /* not used anymore from now on */

    }
    if(!hp) {
      failf(data, "Failed to resolve \"%s\" for SOCKS4 connect.",
            hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
  }

  /*
   * This is currently not supporting "Identification Protocol (RFC1413)".
   */
  socksreq[8] = 0; /* ensure empty userid is NUL-terminated */
  if(proxy_name) {
    size_t plen = strlen(proxy_name);
    if(plen >= sizeof(socksreq) - 8) {
      failf(data, "Too long SOCKS proxy name, can't use!\n");
      return CURLE_COULDNT_CONNECT;
    }
    /* copy the proxy name WITH trailing zero */
    memcpy(socksreq + 8, proxy_name, plen+1);
  }

  /*
   * Make connection
   */
  {
    ssize_t actualread;
    ssize_t written;
    ssize_t hostnamelen = 0;
    int packetsize = 9 +
      (int)strlen((char*)socksreq + 8); /* size including NUL */

    /* If SOCKS4a, set special invalid IP address 0.0.0.x */
    if(protocol4a) {
      socksreq[4] = 0;
      socksreq[5] = 0;
      socksreq[6] = 0;
      socksreq[7] = 1;
      /* If still enough room in buffer, also append hostname */
      hostnamelen = (ssize_t)strlen(hostname) + 1; /* length including NUL */
      if(packetsize + hostnamelen <= SOCKS4REQLEN)
        strcpy((char*)socksreq + packetsize, hostname);
      else
        hostnamelen = 0; /* Flag: hostname did not fit in buffer */
    }

    /* Send request */
    code = Curl_write_plain(conn, sock, (char *)socksreq,
                            packetsize + hostnamelen,
                            &written);
    if(code || (written != packetsize + hostnamelen)) {
      failf(data, "Failed to send SOCKS4 connect request.");
      return CURLE_COULDNT_CONNECT;
    }
    if(protocol4a && hostnamelen == 0) {
      /* SOCKS4a with very long hostname - send that name separately */
      hostnamelen = (ssize_t)strlen(hostname) + 1;
      code = Curl_write_plain(conn, sock, (char *)hostname, hostnamelen,
                              &written);
      if(code || (written != hostnamelen)) {
        failf(data, "Failed to send SOCKS4 connect request.");
        return CURLE_COULDNT_CONNECT;
      }
    }

    packetsize = 8; /* receive data size */

    /* Receive response */
    result = Curl_blockread_all(conn, sock, (char *)socksreq, packetsize,
                                &actualread);
    if(result || (actualread != packetsize)) {
      failf(data, "Failed to receive SOCKS4 connect request ack.");
      return CURLE_COULDNT_CONNECT;
    }

    /*
     * Response format
     *
     *     +----+----+----+----+----+----+----+----+
     *     | VN | CD | DSTPORT |      DSTIP        |
     *     +----+----+----+----+----+----+----+----+
     * # of bytes:  1    1      2              4
     *
     * VN is the version of the reply code and should be 0. CD is the result
     * code with one of the following values:
     *
     * 90: request granted
     * 91: request rejected or failed
     * 92: request rejected because SOCKS server cannot connect to
     *     identd on the client
     * 93: request rejected because the client program and identd
     *     report different user-ids
     */

    /* wrong version ? */
    if(socksreq[0] != 0) {
      failf(data,
            "SOCKS4 reply has wrong version, version should be 4.");
      return CURLE_COULDNT_CONNECT;
    }

    /* Result */
    switch(socksreq[1]) {
    case 90:
      infof(data, "SOCKS4%s request granted.\n", protocol4a?"a":"");
      break;
    case 91:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected or failed.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[8] << 8) | (unsigned char)socksreq[9]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    case 92:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected because SOCKS server cannot connect to "
            "identd on the client.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[8] << 8) | (unsigned char)socksreq[9]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    case 93:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected because the client program and identd "
            "report different user-ids.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[8] << 8) | (unsigned char)socksreq[9]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    default:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", Unknown.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            (((unsigned char)socksreq[8] << 8) | (unsigned char)socksreq[9]),
            (unsigned char)socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    }
  }

  (void)curlx_nonblock(sock, TRUE);

  return CURLE_OK; /* Proxy was successful! */
}